

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

bool IsWellFormedPackage(Package *txns,PackageValidationState *state,bool require_sorted)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  size_type sVar6;
  byte in_DL;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  iVar7;
  int64_t total_weight;
  uint package_count;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  later_txids;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  undefined6 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  string *in_stack_fffffffffffffd08;
  string *reject_reason;
  undefined8 in_stack_fffffffffffffd10;
  PackageValidationResult result;
  PackageValidationResult result_00;
  _Node_iterator_base<uint256,_true> in_stack_fffffffffffffd18;
  ValidationState<PackageValidationResult> *this;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_fffffffffffffd30;
  allocator<char> *in_stack_fffffffffffffd38;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Package *in_stack_fffffffffffffda8;
  bool local_19f;
  undefined1 local_19e;
  undefined1 local_19d [2];
  allocator<char> local_19b;
  undefined1 local_19a [78];
  allocator<char> local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149 [321];
  long local_8;
  
  result = (PackageValidationResult)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  result_00 = (PackageValidationResult)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcf8);
  if (0x19 < (uint)sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
               in_stack_fffffffffffffd38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
               in_stack_fffffffffffffd38);
    local_19f = ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)
                           in_stack_fffffffffffffd18._M_cur,result,in_stack_fffffffffffffd08,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffd07,
                                    CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator(&local_14a);
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator(local_149);
    goto LAB_0050c171;
  }
  cVar4 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd07,
                               CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
  cVar5 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd07,
                             CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,int,IsWellFormedPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,PackageValidationState&,bool)::__0>
                    (cVar4._M_current,cVar5._M_current,0);
  if ((1 < (uint)sVar3) && (0x62a20 < iVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
               in_stack_fffffffffffffd38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
               in_stack_fffffffffffffd38);
    local_19f = ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)
                           in_stack_fffffffffffffd18._M_cur,result,in_stack_fffffffffffffd08,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffd07,
                                    CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator(&local_14c);
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator(&local_14b);
    goto LAB_0050c171;
  }
  std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
  unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                 *)in_stack_fffffffffffffcf8);
  cVar4 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd07,
                               CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
  cVar5 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd07,
                             CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
  std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
  end((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_> *)
      CONCAT17(in_stack_fffffffffffffd07,
               CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
  iVar7 = std::
          inserter<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                    ((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                      *)in_stack_fffffffffffffd08,
                     (__range_iter_t<std::unordered_set<uint256,_SaltedTxidHasher>_>)
                     in_stack_fffffffffffffd18._M_cur);
  std::
  transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::insert_iterator<std::unordered_set<uint256,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<uint256>>>,IsWellFormedPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,PackageValidationState&,bool)::__1>
            (cVar4._M_current,cVar5._M_current,iVar7.container,
             iVar7.iter.super__Node_iterator_base<uint256,_true>._M_cur.
             super__Node_iterator_base<uint256,_true>);
  sVar6 = std::
          unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
          ::size((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                  *)in_stack_fffffffffffffcf8);
  sVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcf8);
  if (sVar6 == sVar3) {
    if ((in_DL & 1) != 0) {
      in_stack_fffffffffffffd46 =
           IsTopoSortedPackage((Package *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      if (!(bool)in_stack_fffffffffffffd46) {
        __a = &local_19b;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd48,
                   (char *)CONCAT17(in_stack_fffffffffffffd47,
                                    CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                   __a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd48,
                   (char *)CONCAT17(in_stack_fffffffffffffd47,
                                    CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                   __a);
        local_19f = ValidationState<PackageValidationResult>::Invalid
                              ((ValidationState<PackageValidationResult> *)
                               in_stack_fffffffffffffd18._M_cur,result,in_stack_fffffffffffffd08,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffd07,
                                        CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00
                                                )));
        std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
        std::allocator<char>::~allocator((allocator<char> *)(local_19d + 1));
        std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
        std::allocator<char>::~allocator(&local_19b);
        goto LAB_0050c153;
      }
    }
    bVar1 = IsConsistentPackage(in_stack_fffffffffffffda8);
    if (bVar1) {
      local_19f = true;
    }
    else {
      this = (ValidationState<PackageValidationResult> *)local_19d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd48,
                 (char *)CONCAT17(in_stack_fffffffffffffd47,
                                  CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                 in_stack_fffffffffffffd38);
      reject_reason = (string *)&local_19e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd48,
                 (char *)CONCAT17(in_stack_fffffffffffffd47,
                                  CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                 in_stack_fffffffffffffd38);
      local_19f = ValidationState<PackageValidationResult>::Invalid
                            (this,result_00,reject_reason,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffd07,
                                      CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00))
                            );
      std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
      std::allocator<char>::~allocator((allocator<char> *)&local_19e);
      std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
      std::allocator<char>::~allocator((allocator<char> *)local_19d);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,
                                CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
               in_stack_fffffffffffffd38);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffd47,
                                        CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40
                                                )),in_stack_fffffffffffffd38);
    local_19f = ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)
                           in_stack_fffffffffffffd18._M_cur,result,in_stack_fffffffffffffd08,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffd07,
                                    CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator((allocator<char> *)local_19a);
    std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
    std::allocator<char>::~allocator((allocator<char> *)(local_19a + 1));
  }
LAB_0050c153:
  std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
  ~unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                  *)in_stack_fffffffffffffcf8);
LAB_0050c171:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19f;
  }
  __stack_chk_fail();
}

Assistant:

bool IsWellFormedPackage(const Package& txns, PackageValidationState& state, bool require_sorted)
{
    const unsigned int package_count = txns.size();

    if (package_count > MAX_PACKAGE_COUNT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-many-transactions");
    }

    const int64_t total_weight = std::accumulate(txns.cbegin(), txns.cend(), 0,
                               [](int64_t sum, const auto& tx) { return sum + GetTransactionWeight(*tx); });
    // If the package only contains 1 tx, it's better to report the policy violation on individual tx weight.
    if (package_count > 1 && total_weight > MAX_PACKAGE_WEIGHT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-large");
    }

    std::unordered_set<uint256, SaltedTxidHasher> later_txids;
    std::transform(txns.cbegin(), txns.cend(), std::inserter(later_txids, later_txids.end()),
                   [](const auto& tx) { return tx->GetHash(); });

    // Package must not contain any duplicate transactions, which is checked by txid. This also
    // includes transactions with duplicate wtxids and same-txid-different-witness transactions.
    if (later_txids.size() != txns.size()) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-contains-duplicates");
    }

    // Require the package to be sorted in order of dependency, i.e. parents appear before children.
    // An unsorted package will fail anyway on missing-inputs, but it's better to quit earlier and
    // fail on something less ambiguous (missing-inputs could also be an orphan or trying to
    // spend nonexistent coins).
    if (require_sorted && !IsTopoSortedPackage(txns, later_txids)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-not-sorted");
    }

    // Don't allow any conflicting transactions, i.e. spending the same inputs, in a package.
    if (!IsConsistentPackage(txns)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "conflict-in-package");
    }
    return true;
}